

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

object * floor_get_oldest_ignored(player *p,chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  object *local_30;
  object *ignore;
  object *obj;
  chunk *c_local;
  player *p_local;
  loc_conflict grid_local;
  
  local_30 = (object *)0x0;
  for (ignore = square_object(c,grid); ignore != (object *)0x0; ignore = ignore->next) {
    _Var1 = ignore_item_ok(p,ignore);
    if (_Var1) {
      local_30 = ignore;
    }
  }
  return local_30;
}

Assistant:

static struct object *floor_get_oldest_ignored(const struct player *p,
		struct chunk *c, struct loc grid)
{
	struct object *obj, *ignore = NULL;

	for (obj = square_object(c, grid); obj; obj = obj->next)
		if (ignore_item_ok(p, obj))
			ignore = obj;

	return ignore;
}